

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IsReadOnly(Parse *pParse,Table *pTab,int viewOk)

{
  int iVar1;
  int viewOk_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  iVar1 = tabIsReadOnly(pParse,pTab);
  if (iVar1 == 0) {
    if ((viewOk == 0) && (pTab->pSelect != (Select *)0x0)) {
      sqlite3ErrorMsg(pParse,"cannot modify %s because it is a view",pTab->zName);
      pParse_local._4_4_ = 1;
    }
    else {
      pParse_local._4_4_ = 0;
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"table %s may not be modified",pTab->zName);
    pParse_local._4_4_ = 1;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsReadOnly(Parse *pParse, Table *pTab, int viewOk){
  if( tabIsReadOnly(pParse, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be modified", pTab->zName);
    return 1;
  }
#ifndef SQLITE_OMIT_VIEW
  if( !viewOk && pTab->pSelect ){
    sqlite3ErrorMsg(pParse,"cannot modify %s because it is a view",pTab->zName);
    return 1;
  }
#endif
  return 0;
}